

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O0

void __thiscall
myvk::FrameManager::CmdPipelineSetScreenSize
          (FrameManager *this,Ptr<myvk::CommandBuffer> *command_buffer)

{
  initializer_list<VkRect2D> __l;
  initializer_list<VkViewport> __l_00;
  element_type *this_00;
  element_type *this_01;
  VkViewport viewport;
  VkRect2D scissor;
  VkExtent2D extent;
  vector<VkRect2D,_std::allocator<VkRect2D>_> *in_stack_ffffffffffffff08;
  allocator<VkViewport> *viewports;
  allocator<VkViewport> local_d9;
  allocator_type *in_stack_ffffffffffffff28;
  allocator_type *__a;
  vector<VkRect2D,_std::allocator<VkRect2D>_> *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  undefined1 *puVar1;
  undefined8 uStack_90;
  iterator local_88;
  allocator<VkRect2D> local_69;
  undefined8 local_68;
  VkExtent2D VStack_60;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_28;
  VkExtent2D VStack_20;
  VkExtent2D local_18;
  
  this_00 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x298d08);
  VStack_20 = Swapchain::GetExtent(this_00);
  local_28 = 0;
  local_18 = VStack_20;
  this_01 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x298d40);
  local_68 = local_28;
  VStack_60 = VStack_20;
  local_50 = &local_68;
  local_48 = 1;
  std::allocator<VkRect2D>::allocator((allocator<VkRect2D> *)0x298d83);
  __l._M_len = in_stack_ffffffffffffff40;
  __l._M_array = in_stack_ffffffffffffff38;
  std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
            (in_stack_ffffffffffffff30,__l,in_stack_ffffffffffffff28);
  CommandBuffer::CmdSetScissor(this_01,in_stack_ffffffffffffff08);
  std::vector<VkRect2D,_std::allocator<VkRect2D>_>::~vector
            ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)this_01);
  std::allocator<VkRect2D>::~allocator(&local_69);
  uStack_90 = (vector<VkViewport,_std::allocator<VkViewport>_> *)
              CONCAT44((float)((ulong)local_18 >> 0x20),(float)((ulong)local_18 & 0xffffffff));
  local_88 = (iterator)0x3f80000000000000;
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x298e25);
  __a = (allocator_type *)0x0;
  puVar1 = &stack0xffffffffffffff28;
  viewports = &local_d9;
  std::allocator<VkViewport>::allocator((allocator<VkViewport> *)0x298e63);
  __l_00._M_len = (size_type)puVar1;
  __l_00._M_array = local_88;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector(uStack_90,__l_00,__a);
  CommandBuffer::CmdSetViewport
            (this_01,(vector<VkViewport,_std::allocator<VkViewport>_> *)viewports);
  std::vector<VkViewport,_std::allocator<VkViewport>_>::~vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)this_01);
  std::allocator<VkViewport>::~allocator(&local_d9);
  return;
}

Assistant:

void FrameManager::CmdPipelineSetScreenSize(const Ptr<myvk::CommandBuffer> &command_buffer) const {
	VkExtent2D extent = m_swapchain->GetExtent();
	VkRect2D scissor = {};
	scissor.extent = extent;
	command_buffer->CmdSetScissor({scissor});
	VkViewport viewport = {};
	viewport.width = (float)extent.width;
	viewport.height = (float)extent.height;
	viewport.maxDepth = 1.0f;
	command_buffer->CmdSetViewport({viewport});
}